

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block_graph.cpp
# Opt level: O3

vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
* IRT::reorderByTracies
            (vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
             *__return_storage_ptr__,
            vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
            *basicBlocks)

{
  pointer puVar1;
  __uniq_ptr_impl<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_> _Var2;
  CStatementList *pCVar3;
  ulong uVar4;
  vector<int,_std::allocator<int>_> newOrder;
  vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  reorderedBlocks;
  allocator_type local_51;
  vector<int,_std::allocator<int>_> local_50;
  vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  local_38;
  
  getReorderedIndecies(&local_50,basicBlocks);
  std::
  vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  ::vector(&local_38,
           (long)(basicBlocks->
                 super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(basicBlocks->
                 super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3,&local_51);
  if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar4 = 0;
    do {
      puVar1 = (basicBlocks->
               super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      _Var2._M_t.
      super__Tuple_impl<0UL,_IRT::CStatementList_*,_std::default_delete<IRT::CStatementList>_>.
      super__Head_base<0UL,_IRT::CStatementList_*,_false>._M_head_impl =
           puVar1[local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar4]]._M_t.
           super___uniq_ptr_impl<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>.
           _M_t;
      puVar1[local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar4]]._M_t.
      super___uniq_ptr_impl<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>._M_t =
           (tuple<IRT::CStatementList_*,_std::default_delete<IRT::CStatementList>_>)0x0;
      pCVar3 = local_38.
               super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_t.
               super___uniq_ptr_impl<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>
               ._M_t.
               super__Tuple_impl<0UL,_IRT::CStatementList_*,_std::default_delete<IRT::CStatementList>_>
               .super__Head_base<0UL,_IRT::CStatementList_*,_false>._M_head_impl;
      local_38.
      super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_t.
      super___uniq_ptr_impl<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>._M_t.
      super__Tuple_impl<0UL,_IRT::CStatementList_*,_std::default_delete<IRT::CStatementList>_>.
      super__Head_base<0UL,_IRT::CStatementList_*,_false>._M_head_impl =
           (CStatementList *)
           _Var2._M_t.
           super__Tuple_impl<0UL,_IRT::CStatementList_*,_std::default_delete<IRT::CStatementList>_>.
           super__Head_base<0UL,_IRT::CStatementList_*,_false>._M_head_impl;
      if (pCVar3 != (CStatementList *)0x0) {
        (**(code **)((long)(pCVar3->super_CStatement).super_IStatement + 0x10))();
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 2));
  }
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       local_38.
       super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       local_38.
       super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_38.
       super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38.
  super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  ::~vector(&local_38);
  if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<CStatementList>> reorderByTracies(
            std::vector<std::unique_ptr<CStatementList>>& basicBlocks) {

        std::vector<int> newOrder = getReorderedIndecies(basicBlocks);
        std::vector<std::unique_ptr<CStatementList>> reorderedBlocks(basicBlocks.size());
        for (int i = 0; i < newOrder.size(); ++i) {
            reorderedBlocks[i] = std::move(basicBlocks[newOrder[i]]);
        }

        return std::move(reorderedBlocks);
    }